

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMLSParserImpl::setParameter(DOMLSParserImpl *this,XMLCh *name,void *value)

{
  XMLEntityHandler *pXVar1;
  int iVar2;
  XMLScanner *pXVar3;
  DOMException *this_00;
  
  iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMResourceResolver);
  if (iVar2 == 0) {
    this->fEntityResolver = (DOMLSResourceResolver *)value;
    pXVar3 = (this->super_AbstractDOMParser).fScanner;
    if (value != (void *)0x0) {
      pXVar1 = &(this->super_AbstractDOMParser).super_XMLEntityHandler;
      pXVar3->fEntityHandler = pXVar1;
      (pXVar3->fReaderMgr).fEntityHandler = pXVar1;
      this->fXMLEntityResolver = (XMLEntityResolver *)0x0;
      return;
    }
  }
  else {
    iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMErrorHandler);
    if (iVar2 == 0) {
      this->fErrorHandler = (DOMErrorHandler *)value;
      pXVar3 = (this->super_AbstractDOMParser).fScanner;
      if (value != (void *)0x0) {
        pXVar3->fErrorReporter = &(this->super_AbstractDOMParser).super_XMLErrorReporter;
        return;
      }
      pXVar3->fErrorReporter = (XMLErrorReporter *)0x0;
      return;
    }
    iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSchemaLocation);
    if (iVar2 == 0) {
      return;
    }
    iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSchemaType);
    if (iVar2 == 0) {
      return;
    }
    iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesEntityResolver);
    if (iVar2 != 0) {
      iVar2 = XMLString::compareIStringASCII
                        (name,(XMLCh *)XMLUni::fgXercesSchemaExternalSchemaLocation);
      if (iVar2 == 0) {
        AbstractDOMParser::setExternalSchemaLocation(&this->super_AbstractDOMParser,(XMLCh *)value);
        return;
      }
      iVar2 = XMLString::compareIStringASCII
                        (name,(XMLCh *)XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation);
      if (iVar2 == 0) {
        AbstractDOMParser::setExternalNoNamespaceSchemaLocation
                  (&this->super_AbstractDOMParser,(XMLCh *)value);
        return;
      }
      iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesSecurityManager);
      if (iVar2 == 0) {
        AbstractDOMParser::setSecurityManager
                  (&this->super_AbstractDOMParser,(SecurityManager *)value);
        return;
      }
      iVar2 = XMLString::compareIStringASCII(name,L"http://apache.org/xml/properties/scannerName");
      if (iVar2 == 0) {
        AbstractDOMParser::useScanner(&this->super_AbstractDOMParser,(XMLCh *)value);
        return;
      }
      iVar2 = XMLString::compareIStringASCII
                        (name,(XMLCh *)XMLUni::fgXercesParserUseDocumentFromImplementation);
      if (iVar2 == 0) {
        AbstractDOMParser::useImplementation(&this->super_AbstractDOMParser,(XMLCh *)value);
        return;
      }
      iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesLowWaterMark);
      if (iVar2 != 0) {
        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(this_00,8,0,(this->super_AbstractDOMParser).fMemoryManager);
        __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
      }
      AbstractDOMParser::setLowWaterMark(&this->super_AbstractDOMParser,*value);
      return;
    }
    this->fXMLEntityResolver = (XMLEntityResolver *)value;
    pXVar3 = (this->super_AbstractDOMParser).fScanner;
    if (value != (void *)0x0) {
      pXVar1 = &(this->super_AbstractDOMParser).super_XMLEntityHandler;
      pXVar3->fEntityHandler = pXVar1;
      (pXVar3->fReaderMgr).fEntityHandler = pXVar1;
      this->fEntityResolver = (DOMLSResourceResolver *)0x0;
      return;
    }
  }
  pXVar3->fEntityHandler = (XMLEntityHandler *)0x0;
  (pXVar3->fReaderMgr).fEntityHandler = (XMLEntityHandler *)0x0;
  return;
}

Assistant:

void DOMLSParserImpl::setParameter(const XMLCh* name, const void* value)
{
    if (XMLString::compareIStringASCII(name, XMLUni::fgDOMResourceResolver) == 0)
    {
        fEntityResolver = (DOMLSResourceResolver*)value;
        if (fEntityResolver) {
            getScanner()->setEntityHandler(this);
            fXMLEntityResolver = 0;
        }
        else {
            getScanner()->setEntityHandler(0);
        }
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMErrorHandler) == 0)
    {
        fErrorHandler = (DOMErrorHandler*)value;
        if (fErrorHandler) {
            getScanner()->setErrorReporter(this);
        }
        else {
            getScanner()->setErrorReporter(0);
        }
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMSchemaLocation) == 0)
    {
        // TODO
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMSchemaType) == 0)
    {
        // TODO
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesEntityResolver) == 0)
    {
        fXMLEntityResolver = (XMLEntityResolver*)value;
        if (fXMLEntityResolver) {
            getScanner()->setEntityHandler(this);
            fEntityResolver = 0;
        }
        else {
          getScanner()->setEntityHandler(0);
        }
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaExternalSchemaLocation) == 0)
    {
      setExternalSchemaLocation((XMLCh*)value);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation) == 0)
    {
      setExternalNoNamespaceSchemaLocation((XMLCh*)value);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSecurityManager) == 0)
    {
      setSecurityManager((SecurityManager*)value);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesScannerName) == 0)
    {
        AbstractDOMParser::useScanner((const XMLCh*) value);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesParserUseDocumentFromImplementation) == 0)
    {
        useImplementation((const XMLCh*) value);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesLowWaterMark) == 0)
    {
        setLowWaterMark(*(const XMLSize_t*)value);
    }
    else
        throw DOMException(DOMException::NOT_FOUND_ERR, 0, getMemoryManager());
}